

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

FT_Fast cf2_stack_popInt(CF2_Stack stack)

{
  CF2_Stack stack_local;
  
  if (stack->top == stack->buffer) {
    cf2_setError(stack->error,0xa1);
    stack_local._4_4_ = 0;
  }
  else if (stack->top[-1].type == CF2_NumberInt) {
    stack->top = stack->top + -1;
    stack_local._4_4_ = (stack->top->u).i;
  }
  else {
    cf2_setError(stack->error,0xa0);
    stack_local._4_4_ = 0;
  }
  return stack_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( CF2_Int )
  cf2_stack_popInt( CF2_Stack  stack )
  {
    if ( stack->top == stack->buffer )
    {
      CF2_SET_ERROR( stack->error, Stack_Underflow );
      return 0;   /* underflow */
    }
    if ( stack->top[-1].type != CF2_NumberInt )
    {
      CF2_SET_ERROR( stack->error, Syntax_Error );
      return 0;   /* type mismatch */
    }

    stack->top--;

    return stack->top->u.i;
  }